

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::JUnitReporter::test_case_reenter(JUnitReporter *this,TestCaseData *in)

{
  char *pcVar1;
  long in_RSI;
  long in_RDI;
  string *classname;
  Timer *in_stack_ffffffffffffff40;
  JUnitTestCaseData *this_00;
  double in_stack_ffffffffffffff48;
  JUnitTestCaseData *in_stack_ffffffffffffff50;
  allocator<char> local_81;
  string local_80 [8];
  vector<doctest::String,_std::allocator<doctest::String>_> *in_stack_ffffffffffffff88;
  vector<doctest::String,_std::allocator<doctest::String>_> *in_stack_ffffffffffffff90;
  allocator local_59;
  string local_58 [16];
  vector<doctest::String,_std::allocator<doctest::String>_> *in_stack_ffffffffffffffb8;
  JUnitTestCaseData *in_stack_ffffffffffffffc0;
  
  detail::Timer::getElapsedSeconds(in_stack_ffffffffffffff40);
  JUnitTestCaseData::addTime(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  JUnitTestCaseData::appendSubcaseNamesToLastTestcase
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
            ((vector<doctest::String,_std::allocator<doctest::String>_> *)in_stack_ffffffffffffff50)
  ;
  std::vector<doctest::String,_std::allocator<doctest::String>_>::clear
            ((vector<doctest::String,_std::allocator<doctest::String>_> *)0x11b29c);
  detail::Timer::start(in_stack_ffffffffffffff40);
  pcVar1 = (char *)(in_RDI + 0x98);
  String::c_str((String *)0x11b2c7);
  pcVar1 = skipPathFromFilename(pcVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,pcVar1,&local_59);
  classname = *(string **)(in_RSI + 0x20);
  this_00 = (JUnitTestCaseData *)&local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,(char *)classname,(allocator *)this_00);
  JUnitTestCaseData::add(this_00,classname,(string *)0x11b341);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return;
}

Assistant:

void test_case_reenter(const TestCaseData& in) override {
            testCaseData.addTime(timer.getElapsedSeconds());
            testCaseData.appendSubcaseNamesToLastTestcase(deepestSubcaseStackNames);
            deepestSubcaseStackNames.clear();

            timer.start();
            testCaseData.add(skipPathFromFilename(in.m_file.c_str()), in.m_name);
        }